

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall sqvector<SQLocalVarInfo>::~sqvector(sqvector<SQLocalVarInfo> *this)

{
  ulong local_18;
  SQUnsignedInteger i;
  sqvector<SQLocalVarInfo> *this_local;
  
  if (this->_allocated != 0) {
    for (local_18 = 0; local_18 < this->_size; local_18 = local_18 + 1) {
      SQLocalVarInfo::~SQLocalVarInfo(this->_vals + local_18);
    }
    sq_vm_free(this->_vals,this->_allocated * 0x28);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }